

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_rangeOfValidSituations_Test::TestBody(Importer_rangeOfValidSituations_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar_;
  unsigned_long local_100;
  string funkyString;
  ValidatorPtr validator;
  ModelPtr flattenedFunkyModel;
  unsigned_long local_a8;
  ParserPtr parser;
  ImporterPtr importer;
  ModelPtr funkyModel;
  ModelPtr importedComponents;
  ModelPtr importedUnits;
  ModelPtr concreteComponents;
  ModelPtr concreteUnits;
  ModelPtr localConcreteUnits;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/units_concrete.cellml",(allocator<char> *)&validator);
  fileContents((string *)&funkyString);
  libcellml::Parser::parseModel((string *)&concreteUnits);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&funkyString,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_
             ,(unsigned_long *)&validator);
  if ((char)funkyString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (funkyString._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)funkyString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&validator,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1d5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&validator,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&validator);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&funkyString._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/components_concrete.cellml",
             (allocator<char> *)&validator);
  fileContents((string *)&funkyString);
  libcellml::Parser::parseModel((string *)&concreteComponents);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&funkyString,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_
             ,(unsigned_long *)&validator);
  if ((char)funkyString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (funkyString._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)funkyString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&validator,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1d8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&validator,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&validator);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&funkyString._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/units_imported.cellml",(allocator<char> *)&validator);
  fileContents((string *)&funkyString);
  libcellml::Parser::parseModel((string *)&importedUnits);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&funkyString,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_
             ,(unsigned_long *)&validator);
  if ((char)funkyString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (funkyString._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)funkyString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&validator,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1de,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&validator,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&validator);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&funkyString._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/components_imported.cellml",
             (allocator<char> *)&validator);
  fileContents((string *)&funkyString);
  libcellml::Parser::parseModel((string *)&importedComponents);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&funkyString,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_
             ,(unsigned_long *)&validator);
  if ((char)funkyString._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (funkyString._M_string_length == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)funkyString._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&validator,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1e1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&validator,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&validator);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&funkyString._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funkyString,"localConcreteUnits",(allocator<char> *)&gtest_ar_);
  libcellml::Model::create((string *)&localConcreteUnits);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funkyString,"units5",(allocator<char> *)&validator);
  libcellml::Units::create((string *)&gtest_ar_);
  libcellml::Model::addUnits
            ((shared_ptr *)
             localConcreteUnits.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&funkyString);
  libcellml::Importer::create(SUB81(&importer,0));
  peVar2 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funkyString,"i_dont_exist_yet.cellml",(allocator<char> *)&gtest_ar_);
  libcellml::Importer::addModel((shared_ptr *)peVar2,(string *)&concreteUnits);
  std::__cxx11::string::~string((string *)&funkyString);
  peVar2 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funkyString,"https://www.example.com/myComponents.cellml",
             (allocator<char> *)&gtest_ar_);
  libcellml::Importer::addModel((shared_ptr *)peVar2,(string *)&concreteComponents);
  std::__cxx11::string::~string((string *)&funkyString);
  peVar2 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/",(allocator<char> *)&validator);
  resourcePath((string *)&funkyString);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)&importedUnits);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  peVar2 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"importer/",(allocator<char> *)&validator);
  resourcePath((string *)&funkyString);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)&importedComponents);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  cVar3 = libcellml::Model::hasUnresolvedImports();
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,cVar3) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&validator);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&funkyString,&gtest_ar_.success_,
               "importedUnits->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&funkyModel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1f1,(char *)CONCAT71(funkyString._M_dataplus._M_p._1_7_,
                                       (char)funkyString._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&funkyModel,(Message *)&validator);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&funkyModel);
    std::__cxx11::string::~string((string *)&funkyString);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&validator);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cVar3 = libcellml::Model::hasUnresolvedImports();
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,cVar3) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&validator);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&funkyString,&gtest_ar_.success_,
               "importedComponents->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&funkyModel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1f2,(char *)CONCAT71(funkyString._M_dataplus._M_p._1_7_,
                                       (char)funkyString._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&funkyModel,(Message *)&validator);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&funkyModel);
    std::__cxx11::string::~string((string *)&funkyString);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&validator);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funkyModel,"importer/components_source.cellml",
             (allocator<char> *)&flattenedFunkyModel);
  resourcePath((string *)&validator);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                 "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"funky\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_imported.cellml\">\n    <units units_ref=\"units1_imported\" name=\"units1FromLibrary\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"components_source.cellml\">\n    <component component_ref=\"component1\" name=\"component1FromLibrary\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\""
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&validator);
  std::operator+(&funkyString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                 "\">\n    <component component_ref=\"component2\" name=\"component2FromLibrary\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"https://www.example.com/myComponents.cellml\">\n    <component component_ref=\"component3\" name=\"component3FromLibrary\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"i_dont_exist_yet.cellml\">\n    <units units_ref=\"units4\" name=\"units4FromLibrary\"/>\n  </import>\n</model>"
                );
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::~string((string *)&funkyModel);
  libcellml::Parser::parseModel((string *)&funkyModel);
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  flattenedFunkyModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_,"size_t(0)","parser->issueCount()",(unsigned_long *)&validator,
             (unsigned_long *)&flattenedFunkyModel);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&validator);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&flattenedFunkyModel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x212,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&flattenedFunkyModel,(Message *)&validator);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&flattenedFunkyModel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&validator);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"importer/",(allocator<char> *)&flattenedFunkyModel);
  resourcePath((string *)&gtest_ar_);
  libcellml::Importer::resolveImports
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&funkyModel);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&validator);
  cVar3 = libcellml::Model::hasUnresolvedImports();
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,cVar3) ^ 1);
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&flattenedFunkyModel);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar_,(char *)&validator,"funkyModel->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x217,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_100,(Message *)&flattenedFunkyModel);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&flattenedFunkyModel);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  flattenedFunkyModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_,"size_t(0)","importer->issueCount()",(unsigned_long *)&validator
             ,(unsigned_long *)&flattenedFunkyModel);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&validator);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&flattenedFunkyModel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x218,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&flattenedFunkyModel,(Message *)&validator);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&flattenedFunkyModel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&validator);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Validator::create();
  libcellml::Validator::validateModel
            ((shared_ptr *)
             validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  flattenedFunkyModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_100 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_,"size_t(0)","validator->issueCount()",
             (unsigned_long *)&flattenedFunkyModel,&local_100);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&flattenedFunkyModel);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x21d,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_100,(Message *)&flattenedFunkyModel);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&flattenedFunkyModel);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Importer::flattenModel((shared_ptr *)&flattenedFunkyModel);
  local_100 = 0;
  local_a8 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_,"size_t(0)","importer->issueCount()",&local_100,&local_a8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x221,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = flattenedFunkyModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"flattenedFunkyModel",(allocator<char> *)&local_100);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  libcellml::Validator::validateModel
            ((shared_ptr *)
             validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_100 = 0;
  local_a8 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_,"size_t(0)","validator->issueCount()",&local_100,&local_a8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x225,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&flattenedFunkyModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&funkyModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&funkyString);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&localConcreteUnits.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importedComponents.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importedUnits.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&concreteComponents.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&concreteUnits.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Importer, rangeOfValidSituations)
{
    // This is a test to figure out whether we need to restrict the library keys to absolute URLs, or
    // whether they could be any string.  This test creates a collection of models from different sources,
    // some which need imports, some not, and uses them to resolve imports on another model.
    auto parser = libcellml::Parser::create();

    // Parsing concrete units and components.
    auto concreteUnits = parser->parseModel(fileContents("importer/units_concrete.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto concreteComponents = parser->parseModel(fileContents("importer/components_concrete.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Parsing a model which imports components and units from files called units_source.cellml
    // and components_source.cellml respectively.  These "hidden" files will also be added to the importer
    // library when they're resolved.
    auto importedUnits = parser->parseModel(fileContents("importer/units_imported.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importedComponents = parser->parseModel(fileContents("importer/components_imported.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Create models through the API. These don't need import resolution.
    auto localConcreteUnits = libcellml::Model::create("localConcreteUnits");
    localConcreteUnits->addUnits(libcellml::Units::create("units5"));

    // Add all the concrete models to the Importer. These don't need resolving as they have no imports of their own.
    auto importer = libcellml::Importer::create();
    importer->addModel(concreteUnits, "i_dont_exist_yet.cellml"); // add with key that's not a file (yet).
    importer->addModel(concreteComponents, "https://www.example.com/myComponents.cellml"); // add with a key that is a remote URL.

    // Add models which have imports to the Importer by resolving them. They are automatically saved into the
    // Importer's library, along with any dependencies, under the names used to resolve them.
    importer->resolveImports(importedUnits, resourcePath("importer/"));
    importer->resolveImports(importedComponents, resourcePath("importer/"));

    EXPECT_FALSE(importedUnits->hasUnresolvedImports());
    EXPECT_FALSE(importedComponents->hasUnresolvedImports());

    // Now create a funky model that imports from all over the place and see what happens.
    const std::string funkyString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"funky\">\n"
        // Status quo functionality, key is relative URL + base file path as the relative URL doesn't exist as a key.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_imported.cellml\">\n"
        "    <units units_ref=\"units1_imported\" name=\"units1FromLibrary\"/>\n"
        "  </import>\n"
        // Use the relative URL for a hidden child source component.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"components_source.cellml\">\n"
        "    <component component_ref=\"component1\" name=\"component1FromLibrary\"/>\n"
        "  </import>\n"
        // Use the absolute URL for a hidden child source component.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\""
        + resourcePath("importer/components_source.cellml")
        + "\">\n"
          "    <component component_ref=\"component2\" name=\"component2FromLibrary\"/>\n"
          "  </import>\n"
          // Remote website URL used for key.
          "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"https://www.example.com/myComponents.cellml\">\n"
          "    <component component_ref=\"component3\" name=\"component3FromLibrary\"/>\n"
          "  </import>\n"
          // Currently non-existent file used for the key. For this CellML file to function outside of the
          // the Importer instance, this model needs to be written to this location.
          "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"i_dont_exist_yet.cellml\">\n"
          "    <units units_ref=\"units4\" name=\"units4FromLibrary\"/>\n"
          "  </import>\n"
          "</model>";

    auto funkyModel = parser->parseModel(funkyString);
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Pass in a base file path, this will be used to resolve URLs if they don't already exist as keys.
    // This allows the model to be resolved against different locations where local files are specified.
    importer->resolveImports(funkyModel, resourcePath("importer/"));
    EXPECT_FALSE(funkyModel->hasUnresolvedImports());
    EXPECT_EQ(size_t(0), importer->issueCount());

    // Funky hrefs are valid ...
    auto validator = libcellml::Validator::create();
    validator->validateModel(funkyModel);
    EXPECT_EQ(size_t(0), validator->issueCount());

    // ... and can be flattened as expected too.
    auto flattenedFunkyModel = importer->flattenModel(funkyModel);
    EXPECT_EQ(size_t(0), importer->issueCount());

    flattenedFunkyModel->setName("flattenedFunkyModel");
    validator->validateModel(flattenedFunkyModel);
    EXPECT_EQ(size_t(0), validator->issueCount());
}